

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# writer.cpp
# Opt level: O0

writer * argo::operator<<(writer *w,char c)

{
  allocator local_39;
  string local_38 [37];
  char local_13 [3];
  char s [2];
  writer *pwStack_10;
  char c_local;
  writer *w_local;
  
  local_13[1] = 0;
  local_13[0] = c;
  local_13[2] = c;
  pwStack_10 = w;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,local_13,&local_39);
  (*w->_vptr_writer[2])(w,local_38);
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  return pwStack_10;
}

Assistant:

writer &NAMESPACE::operator<<(writer& w, char c)
{
    char s[2];
    s[0] = c;
    s[1] = '\0';
    w.write(s);
    return w;
}